

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void anon_unknown.dwarf_e2e38::dumpBuffer(SimdAlignedBuffer64f *buffer)

{
  ostream *poVar1;
  long *in_RDI;
  int j;
  int i;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,*(float *)(*in_RDI + (long)(local_c * 8 + local_10) * 4));
      std::operator<<(poVar1,"  ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
dumpBuffer (const SimdAlignedBuffer64f& buffer)
{
    for (int i = 0; i < 8; ++i)
    {
        for (int j = 0; j < 8; ++j)
        {
            cout << buffer._buffer[i * 8 + j] << "  ";
        }
        cout << endl;
    }
}